

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_776f::TENSOR_SWAP_AXIS_Test::TestBody(TENSOR_SWAP_AXIS_Test *this)

{
  int *piVar1;
  long lVar2;
  char *pcVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_06;
  initializer_list<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __l_07;
  array<unsigned_int,_3UL> size;
  allocator_type local_1b9;
  allocator_type local_1b8;
  allocator_type local_1b7;
  allocator_type local_1b6;
  allocator_type local_1b5;
  allocator_type local_1b4;
  allocator_type local_1b3;
  allocator_type local_1b2;
  allocator_type local_1b1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1b0 [2];
  _Vector_base<int,_std::allocator<int>_> local_180;
  vector<int,_std::allocator<int>_> local_168;
  vector<int,_std::allocator<int>_> local_150;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> local_120;
  vector<int,_std::allocator<int>_> local_108;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_f0;
  tensor<int,_3U> local_d8;
  int local_98 [26];
  
  local_98[0x14] = 1;
  local_98[0x15] = 2;
  local_98[0x16] = 3;
  local_98[0x17] = 4;
  __l._M_len = 4;
  __l._M_array = local_98 + 0x14;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar,__l,&local_1b1);
  local_98[0x10] = 5;
  local_98[0x11] = 6;
  local_98[0x12] = 7;
  local_98[0x13] = 8;
  __l_00._M_len = 4;
  __l_00._M_array = local_98 + 0x10;
  std::vector<int,_std::allocator<int>_>::vector(&local_120,__l_00,&local_1b2);
  local_98[0xc] = 9;
  local_98[0xd] = 10;
  local_98[0xe] = 0xb;
  local_98[0xf] = 0xc;
  __l_01._M_len = 4;
  __l_01._M_array = local_98 + 0xc;
  std::vector<int,_std::allocator<int>_>::vector(&local_108,__l_01,&local_1b3);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_1b0,__l_02,&local_1b4);
  local_98[8] = 1;
  local_98[9] = 2;
  local_98[10] = 3;
  local_98[0xb] = 4;
  __l_03._M_len = 4;
  __l_03._M_array = local_98 + 8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_180,__l_03,&local_1b5);
  local_98[4] = 5;
  local_98[5] = 6;
  local_98[6] = 7;
  local_98[7] = 8;
  __l_04._M_len = 4;
  __l_04._M_array = local_98 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_168,__l_04,&local_1b6);
  local_98[0] = 9;
  local_98[1] = 10;
  local_98[2] = 0xb;
  local_98[3] = 0xc;
  __l_05._M_len = 4;
  __l_05._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_150,__l_05,&local_1b7);
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)&local_180;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_1b0 + 1,__l_06,&local_1b8);
  __l_07._M_len = 2;
  __l_07._M_array = local_1b0;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&local_f0,__l_07,&local_1b9);
  size._M_elems[2] = 4;
  size._M_elems[0] = 2;
  size._M_elems[1] = 3;
  dnet::data_types::tensor<int,_3U>::tensor(&local_d8,&local_f0,size);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&local_f0);
  lVar2 = 0x18;
  do {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)((long)&local_1b0[0].
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x30;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&local_180._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x30;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_180._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000001;
  local_180._M_impl.super__Vector_impl_data._M_finish._0_4_ = 2;
  piVar1 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_d8,(array<unsigned_int,_3UL> *)&local_180);
  local_1b0[0].
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(ts[{1, 1, 2}])","7",piVar1,(int *)local_1b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b0,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_180._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000001;
  local_180._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
  piVar1 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_d8,(array<unsigned_int,_3UL> *)&local_180);
  local_1b0[0].
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(ts[{1, 2, 1}])","7",piVar1,(int *)local_1b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b0,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_180._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000002;
  local_180._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
  piVar1 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_d8,(array<unsigned_int,_3UL> *)&local_180);
  local_1b0[0].
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(ts[{2, 1, 1}])","7",piVar1,(int *)local_1b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b0,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_180._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  local_180._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
  piVar1 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_d8,(array<unsigned_int,_3UL> *)&local_180);
  local_1b0[0].
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(ts[{3, 0, 1}])","8",piVar1,(int *)local_1b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b0,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d8);
  return;
}

Assistant:

TEST(TENSOR, SWAP_AXIS) {
        try {
            tensor<int, 3> ts({
                                      {
                                              {1, 2, 3, 4},
                                              {5, 6, 7, 8},
                                              {9, 10, 11, 12}
                                      },
                                      {
                                              {1, 2, 3, 4},
                                              {5, 6, 7, 8},
                                              {9, 10, 11, 12}
                                      }
                              }, {2, 3, 4});
            EXPECT_EQ((ts[{1, 1, 2}]), 7);
            ts.swap_axis(1, 2);
            EXPECT_EQ((ts[{1, 2, 1}]), 7);
            ts.swap_axis(0, 1);
            EXPECT_EQ((ts[{2, 1, 1}]), 7);
            EXPECT_EQ((ts[{3, 0, 1}]), 8);
        }
        catch (const dnet::misc::exception &e) {
            std::cout << e << std::endl;
        }
    }